

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enum_data.hpp
# Opt level: O2

void duckdb::ArrowEnumData<signed_char>::Finalize
               (ArrowAppendData *append_data,LogicalType *type,ArrowArray *result)

{
  ArrowBuffer *pAVar1;
  reference pvVar2;
  ArrowArray *pAVar3;
  long lVar4;
  ArrowArray *pAVar5;
  byte bVar6;
  _Head_base<0UL,_duckdb::ArrowAppendData_*,_false> local_38;
  LogicalType local_30;
  
  bVar6 = 0;
  result->n_buffers = 2;
  pAVar1 = ArrowAppendData::GetMainBuffer(append_data);
  result->buffers[1] = pAVar1->dataptr;
  result->dictionary = &append_data->dictionary;
  LogicalType::LogicalType(&local_30,VARCHAR);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>,_true>
           ::get<true>(&append_data->child_data,0);
  local_38._M_head_impl =
       (pvVar2->
       super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>
       .super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl;
  (pvVar2->super_unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>)
  ._M_t.
  super___uniq_ptr_impl<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::ArrowAppendData_*,_std::default_delete<duckdb::ArrowAppendData>_>.
  super__Head_base<0UL,_duckdb::ArrowAppendData_*,_false>._M_head_impl = (ArrowAppendData *)0x0;
  pAVar3 = ArrowAppender::FinalizeChild
                     (&local_30,
                      (unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>,_true>
                       *)&local_38);
  pAVar5 = &append_data->dictionary;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    pAVar5->length = pAVar3->length;
    pAVar3 = (ArrowArray *)((long)pAVar3 + (ulong)bVar6 * -0x10 + 8);
    pAVar5 = (ArrowArray *)((long)pAVar5 + (ulong)bVar6 * -0x10 + 8);
  }
  ::std::unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_>::
  ~unique_ptr((unique_ptr<duckdb::ArrowAppendData,_std::default_delete<duckdb::ArrowAppendData>_> *)
              &local_38);
  LogicalType::~LogicalType(&local_30);
  return;
}

Assistant:

static void Finalize(ArrowAppendData &append_data, const LogicalType &type, ArrowArray *result) {
		result->n_buffers = 2;
		result->buffers[1] = append_data.GetMainBuffer().data();
		// finalize the enum child data, and assign it to the dictionary
		result->dictionary = &append_data.dictionary;
		append_data.dictionary =
		    *ArrowAppender::FinalizeChild(LogicalType::VARCHAR, std::move(append_data.child_data[0]));
	}